

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_sock_open(nni_sock **sockp,nni_proto *proto)

{
  int iVar1;
  nni_sock *pnStack_28;
  int rv;
  nni_sock *s;
  nni_proto *proto_local;
  nni_sock **sockp_local;
  
  pnStack_28 = (nni_sock *)0x0;
  if (proto->proto_version == 0x50520003) {
    s = (nni_sock *)proto;
    proto_local = (nni_proto *)sockp;
    sockp_local._4_4_ = nni_sock_create(&stack0xffffffffffffffd8,proto);
    if (sockp_local._4_4_ == 0) {
      nni_mtx_lock(&sock_lk);
      iVar1 = nni_id_alloc32(&sock_ids,&pnStack_28->s_id,pnStack_28);
      if (iVar1 == 0) {
        nni_list_append(&sock_list,pnStack_28);
        (*(pnStack_28->s_sock_ops).sock_open)(pnStack_28->s_data);
        *(nni_sock **)proto_local = pnStack_28;
        nni_mtx_unlock(&sock_lk);
        nni_stat_set_id(&pnStack_28->st_id,pnStack_28->s_id);
        nni_stat_set_id(&pnStack_28->st_root,pnStack_28->s_id);
        nni_stat_register(&pnStack_28->st_root);
        sockp_local._4_4_ = 0;
      }
      else {
        nni_mtx_unlock(&sock_lk);
        sock_destroy(pnStack_28);
        sockp_local._4_4_ = iVar1;
      }
    }
  }
  else {
    sockp_local._4_4_ = 9;
  }
  return sockp_local._4_4_;
}

Assistant:

int
nni_sock_open(nni_sock **sockp, const nni_proto *proto)
{
	nni_sock *s = NULL;
	int       rv;

	if (proto->proto_version != NNI_PROTOCOL_VERSION) {
		// unsupported protocol version
		return (NNG_ENOTSUP);
	}

	if ((rv = nni_sock_create(&s, proto)) != 0) {
		return (rv);
	}

	nni_mtx_lock(&sock_lk);
	if ((rv = nni_id_alloc32(&sock_ids, &s->s_id, s)) != 0) {
		nni_mtx_unlock(&sock_lk);
		sock_destroy(s);
		return (rv);
	} else {
		nni_list_append(&sock_list, s);
		s->s_sock_ops.sock_open(s->s_data);
		*sockp = s;
	}
	nni_mtx_unlock(&sock_lk);

#ifdef NNG_ENABLE_STATS
	// Set up basic stat values.  The socket id wasn't
	// known at stat creation time, so we set it now.
	nni_stat_set_id(&s->st_id, (int) s->s_id);
	nni_stat_set_id(&s->st_root, (int) s->s_id);

	// Add our stats chain.
	nni_stat_register(&s->st_root);
#endif

	return (0);
}